

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

uint8_t * WebPIDecGetRGB(WebPIDecoder *idec,int *last_y,int *width,int *height,int *stride)

{
  WebPDecBuffer *pWVar1;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  WebPIDecoder *in_RDI;
  int *in_R8;
  WebPDecBuffer *src;
  uint8_t *local_8;
  
  pWVar1 = GetOutputBuffer(in_RDI);
  if (pWVar1 == (WebPDecBuffer *)0x0) {
    local_8 = (uint8_t *)0x0;
  }
  else if (pWVar1->colorspace < MODE_YUV) {
    if (in_RSI != (int *)0x0) {
      *in_RSI = (in_RDI->params).last_y;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = pWVar1->width;
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = pWVar1->height;
    }
    if (in_R8 != (int *)0x0) {
      *in_R8 = (pWVar1->u).RGBA.stride;
    }
    local_8 = (pWVar1->u).RGBA.rgba;
  }
  else {
    local_8 = (uint8_t *)0x0;
  }
  return local_8;
}

Assistant:

WEBP_NODISCARD uint8_t* WebPIDecGetRGB(const WebPIDecoder* idec, int* last_y,
                                       int* width, int* height, int* stride) {
  const WebPDecBuffer* const src = GetOutputBuffer(idec);
  if (src == NULL) return NULL;
  if (src->colorspace >= MODE_YUV) {
    return NULL;
  }

  if (last_y != NULL) *last_y = idec->params.last_y;
  if (width != NULL) *width = src->width;
  if (height != NULL) *height = src->height;
  if (stride != NULL) *stride = src->u.RGBA.stride;

  return src->u.RGBA.rgba;
}